

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 uVar5;
  FastAllocator *pFVar6;
  tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_00;
  iterator __position;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined8 uVar8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar9;
  char cVar10;
  long *plVar11;
  ThreadLocal2 *this_01;
  BuildPrim *pBVar12;
  undefined1 (*pauVar13) [16];
  int *piVar14;
  size_t sVar15;
  runtime_error *this_02;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  MutexSys *pMVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  size_type sVar25;
  uint uVar26;
  ulong uVar27;
  MutexSys *pMVar28;
  char *pcVar29;
  size_t *psVar30;
  range<unsigned_int> *prVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  task_group_context context;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  auto_partitioner local_2f9;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  MutexSys *local_2d8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2d0;
  size_t local_2c8;
  blocked_range<unsigned_long> local_2c0;
  range<unsigned_int> local_2a8;
  range<unsigned_int> local_2a0 [7];
  undefined1 local_268 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_248 [2];
  string_resource_index local_228;
  anon_class_32_4_e5015336 local_1e0;
  anon_class_8_1_898bcfc2 local_1c0;
  ThreadLocal2 local_1b8 [2];
  
  local_2e8._8_8_ = local_2e8._0_8_;
  local_2f8._8_8_ = local_2f8._0_8_;
  local_2f8._0_8_ = current;
  local_2d0 = __return_storage_ptr__;
  local_2c8 = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    pFVar6 = (this->createAllocator->super_Create).allocator;
    plVar11 = (long *)__tls_get_addr(&PTR_021a7d38);
    this_01 = (ThreadLocal2 *)*plVar11;
    local_2e8._0_8_ = pFVar6;
    if (this_01 == (ThreadLocal2 *)0x0) {
      this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)this_01);
      (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_01->alloc0).parent = this_01;
      auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc0).ptr = (char *)auVar33._0_8_;
      (this_01->alloc0).cur = auVar33._8_8_;
      (this_01->alloc0).end = auVar33._16_8_;
      (this_01->alloc0).allocBlockSize = auVar33._24_8_;
      (this_01->alloc0).end = auVar33._0_8_;
      (this_01->alloc0).allocBlockSize = auVar33._8_8_;
      (this_01->alloc0).bytesUsed = auVar33._16_8_;
      (this_01->alloc0).bytesWasted = auVar33._24_8_;
      (this_01->alloc1).parent = this_01;
      auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc1).ptr = (char *)auVar33._0_8_;
      (this_01->alloc1).cur = auVar33._8_8_;
      (this_01->alloc1).end = auVar33._16_8_;
      (this_01->alloc1).allocBlockSize = auVar33._24_8_;
      (this_01->alloc1).end = auVar33._0_8_;
      (this_01->alloc1).allocBlockSize = auVar33._8_8_;
      (this_01->alloc1).bytesUsed = auVar33._16_8_;
      (this_01->alloc1).bytesWasted = auVar33._24_8_;
      *plVar11 = (long)this_01;
      local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
      local_1b8[0].alloc._M_b._M_p._0_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_268._0_8_ = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_268);
      if ((ThreadLocal2 *)local_268._0_8_ != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_268,
                   (ThreadLocal2 *)local_268._0_8_);
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    }
    alloc.talloc0 = &this_01->alloc0;
    alloc.talloc1 = &this_01->alloc1;
    if (((FastAllocator *)local_2e8._0_8_)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    current = (range<unsigned_int> *)local_2f8._0_8_;
    alloc.alloc = (FastAllocator *)local_2e8._0_8_;
  }
  local_2e8._0_8_ = alloc.alloc;
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
    current = (range<unsigned_int> *)local_2f8._0_8_;
  }
  pBVar9 = local_2d0;
  if ((this->super_Settings).maxDepth <= depth + 8) {
LAB_0146f113:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(local_2d0,this,depth,current,alloc_01);
    return pBVar9;
  }
  uVar22 = (ulong)current->_begin;
  uVar23 = current->_end;
  uVar20 = (ulong)uVar23;
  if ((ulong)(uVar23 - current->_begin) <= (this->super_Settings).minLeafSize) goto LAB_0146f113;
  pBVar12 = this->morton;
  uVar26 = pBVar12[uVar22].field_0.field_0.code;
  uVar23 = pBVar12[uVar23 - 1].field_0.field_0.code;
  if (uVar26 == uVar23) {
LAB_0146f139:
    recreateMortonCodes(this,current);
    pBVar12 = this->morton;
    uVar23 = *(uint *)local_2f8._0_8_;
    uVar22 = (ulong)uVar23;
    uVar26 = *(uint *)(local_2f8._0_8_ + 4);
    uVar20 = (ulong)uVar26;
    uVar4 = pBVar12[uVar22].field_0.field_0.code;
    uVar24 = pBVar12[uVar26 - 1].field_0.field_0.code;
    current = (range<unsigned_int> *)local_2f8._0_8_;
    if (uVar4 != uVar24) {
      uVar24 = uVar24 ^ uVar4;
      iVar16 = 0x1f;
      if (uVar24 != 0) {
        for (; uVar24 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      if (iVar16 != -1) goto LAB_0146eb1d;
    }
    uVar26 = uVar23 + uVar26 >> 1;
    uVar19 = (ulong)uVar26;
    local_2a8._end = uVar26;
    local_2a8._begin = uVar23;
  }
  else {
    uVar23 = uVar23 ^ uVar26;
    iVar16 = 0x1f;
    if (uVar23 != 0) {
      for (; uVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    if (iVar16 == -1) goto LAB_0146f139;
LAB_0146eb1d:
    uVar23 = (uint)uVar20;
    uVar19 = uVar22;
    uVar27 = uVar20;
    if ((int)uVar22 + 1U != uVar23) {
      do {
        uVar23 = (uint)((int)uVar27 + (int)uVar19) >> 1;
        uVar18 = (ulong)uVar23;
        if ((pBVar12[uVar23].field_0.field_0.code & 0x80000000U >> (~(byte)iVar16 & 0x1f)) == 0) {
          uVar19 = (ulong)uVar23;
          uVar18 = uVar27;
        }
        uVar23 = (uint)uVar18;
        uVar27 = uVar18;
      } while ((int)uVar19 + 1U != uVar23);
    }
    uVar19 = (ulong)uVar23;
    local_2a8 = (range<unsigned_int>)(uVar22 | uVar19 << 0x20);
  }
  local_2a0[0] = (range<unsigned_int>)(uVar20 << 0x20 | uVar19);
  pMVar28 = (MutexSys *)0x2;
  if (2 < (this->super_Settings).branchingFactor) {
    do {
      uVar22 = 0;
      uVar20 = 0xffffffff;
      uVar23 = 0;
      do {
        uVar26 = (&local_2a8)[uVar22]._end - local_2a0[uVar22 - 1]._begin;
        if ((this->super_Settings).minLeafSize < (ulong)uVar26 && uVar23 < uVar26) {
          uVar20 = uVar22 & 0xffffffff;
          uVar23 = uVar26;
        }
        uVar22 = uVar22 + 1;
      } while ((MutexSys *)(uVar22 & 0xffffffff) < pMVar28);
      iVar16 = (int)uVar20;
      if (iVar16 == -1) break;
      prVar31 = local_2a0 + (long)iVar16 + -1;
      uVar22 = (ulong)prVar31->_begin;
      uVar20 = (ulong)(&local_2a8)[iVar16]._end;
      uVar23 = pBVar12[uVar22].field_0.field_0.code;
      uVar26 = pBVar12[(&local_2a8)[iVar16]._end - 1].field_0.field_0.code;
      if (uVar23 == uVar26) {
LAB_0146ec60:
        recreateMortonCodes(this,prVar31);
        pBVar12 = this->morton;
        uVar23 = prVar31->_begin;
        uVar22 = (ulong)uVar23;
        uVar26 = (&local_2a8)[iVar16]._end;
        uVar20 = (ulong)uVar26;
        uVar4 = pBVar12[uVar22].field_0.field_0.code;
        uVar24 = pBVar12[uVar26 - 1].field_0.field_0.code;
        current = (range<unsigned_int> *)local_2f8._0_8_;
        if (uVar4 != uVar24) {
          uVar24 = uVar24 ^ uVar4;
          iVar17 = 0x1f;
          if (uVar24 != 0) {
            for (; uVar24 >> iVar17 == 0; iVar17 = iVar17 + -1) {
            }
          }
          if (iVar17 != -1) goto LAB_0146ebf3;
        }
        uVar26 = uVar23 + uVar26 >> 1;
        uVar19 = (ulong)uVar26;
        sVar25 = CONCAT44(uVar26,uVar23);
      }
      else {
        uVar26 = uVar26 ^ uVar23;
        iVar17 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> iVar17 == 0; iVar17 = iVar17 + -1) {
          }
        }
        if (iVar17 == -1) goto LAB_0146ec60;
LAB_0146ebf3:
        uVar23 = (uint)uVar20;
        uVar19 = uVar20;
        uVar27 = uVar22;
        if ((int)uVar22 + 1U != uVar23) {
          do {
            uVar18 = (ulong)((uint)((int)uVar19 + (int)uVar27) >> 1);
            if ((pBVar12[uVar18].field_0.field_0.code & 0x80000000U >> (~(byte)iVar17 & 0x1f)) != 0)
            {
              uVar19 = uVar18;
              uVar18 = uVar27;
            }
            uVar23 = (uint)uVar19;
            uVar27 = uVar18;
          } while ((int)uVar18 + 1U != uVar23);
        }
        uVar19 = (ulong)uVar23;
        sVar25 = uVar22 | uVar19 << 0x20;
      }
      *prVar31 = *(range<unsigned_int> *)(&local_2c0.my_grainsize + (long)pMVar28);
      (&local_2c0.my_grainsize)[(long)pMVar28] = sVar25;
      local_2a0[(long)((long)&pMVar28[-1].mutex + 7)] =
           (range<unsigned_int>)(uVar20 << 0x20 | uVar19);
      pMVar28 = (MutexSys *)((long)&pMVar28->mutex + 1);
    } while (pMVar28 < (MutexSys *)(this->super_Settings).branchingFactor);
  }
  local_2c0.my_end = 0x80;
  this_00.
  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
        )(alloc.talloc0)->parent;
  if ((__pointer_type)local_2e8._0_8_ !=
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p) {
    local_268[8] = '\x01';
    local_268._0_8_ =
         this_00.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)
                   this_00.
                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
                  );
    if ((((atomic<embree::FastAllocator_*> *)
         ((long)this_00.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         8))->_M_b)._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xa8) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x68);
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)this_00.
                                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    .
                                    super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                    ._M_head_impl + 0x58) +
            (long)*(void **)((long)this_00.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x98)) -
           ((long)*(void **)((long)this_00.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x50) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x90)));
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xb0) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x70);
      UNLOCK();
    }
    auVar32 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])
     ((long)this_00.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x58
     ) = ZEXT1632(auVar32);
    *(undefined1 (*) [32])
     ((long)this_00.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x48
     ) = ZEXT1632(auVar32);
    uVar8 = local_2e8._0_8_;
    auVar33 = ZEXT1632(auVar32);
    if ((__pointer_type)local_2e8._0_8_ == (__pointer_type)0x0) {
      *(undefined1 (*) [32])
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x98) = auVar33;
      *(undefined1 (*) [32])
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x88) = auVar33;
    }
    else {
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = *(void **)(local_2e8._0_8_ + 0x10);
      *(undefined1 (*) [32])
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x88) = auVar33;
      *(undefined1 (*) [32])
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x98) = auVar33;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = *(void **)(local_2e8._0_8_ + 0x10);
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8))
    ->_M_b)._M_p = (__pointer_type)local_2e8._0_8_;
    UNLOCK();
    local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_1b8[0].alloc._M_b._M_p._0_1_ = 1;
    local_1e0.bounds =
         (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])
         this_00.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            *)(uVar8 + 0x130))->
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           *)(uVar8 + 0x130))->
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)(uVar8 + 0x130),__position,(ThreadLocal2 **)&local_1e0);
      if (((byte)local_1b8[0].alloc._M_b._M_p & 1) != 0) goto LAB_0146ee03;
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_1e0.bounds;
      pppTVar2 = &(((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                     *)(uVar8 + 0x130))->
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
LAB_0146ee03:
      MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
    }
    if (local_268[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_268._0_8_);
    }
    current = (range<unsigned_int> *)local_2f8._0_8_;
  }
  (alloc.talloc0)->bytesUsed = (long)(void **)local_2c0.my_end + (alloc.talloc0)->bytesUsed;
  sVar15 = (alloc.talloc0)->cur;
  uVar20 = (ulong)(-(int)sVar15 & 0xf);
  uVar22 = (long)(void **)local_2c0.my_end + uVar20 + sVar15;
  (alloc.talloc0)->cur = uVar22;
  local_2d8 = pMVar28;
  if (uVar22 <= (alloc.talloc0)->end) {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar20;
    pcVar29 = (alloc.talloc0)->ptr + (uVar22 - local_2c0.my_end);
    goto LAB_0146ee65;
  }
  (alloc.talloc0)->cur = sVar15;
  if ((MutexSys *)(alloc.talloc0)->allocBlockSize < (MutexSys *)(local_2c0.my_end << 2)) {
    pcVar29 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8._0_8_,(size_t)&local_2c0);
  }
  else {
    local_1b8[0].mutex.mutex = (MutexSys *)(alloc.talloc0)->allocBlockSize;
    pcVar29 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8._0_8_,(size_t)local_1b8);
    (alloc.talloc0)->ptr = pcVar29;
    sVar15 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
    (alloc.talloc0)->bytesWasted = sVar15;
    (alloc.talloc0)->end = (size_t)local_1b8[0].mutex.mutex;
    (alloc.talloc0)->cur = local_2c0.my_end;
    if (local_1b8[0].mutex.mutex < local_2c0.my_end) {
      (alloc.talloc0)->cur = 0;
      local_1b8[0].mutex.mutex = (void *)(alloc.talloc0)->allocBlockSize;
      pcVar29 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8._0_8_,(size_t)local_1b8);
      (alloc.talloc0)->ptr = pcVar29;
      sVar15 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar15;
      (alloc.talloc0)->end = (size_t)local_1b8[0].mutex.mutex;
      (alloc.talloc0)->cur = local_2c0.my_end;
      if (local_1b8[0].mutex.mutex < local_2c0.my_end) {
        (alloc.talloc0)->cur = 0;
        pcVar29 = (char *)0x0;
        goto LAB_0146f202;
      }
    }
    (alloc.talloc0)->bytesWasted = sVar15;
  }
LAB_0146f202:
  current = (range<unsigned_int> *)local_2f8._0_8_;
LAB_0146ee65:
  pcVar29[0x60] = '\0';
  pcVar29[0x61] = '\0';
  pcVar29[0x62] = -0x80;
  pcVar29[99] = '\x7f';
  pcVar29[100] = '\0';
  pcVar29[0x65] = '\0';
  pcVar29[0x66] = -0x80;
  pcVar29[0x67] = '\x7f';
  pcVar29[0x68] = '\0';
  pcVar29[0x69] = '\0';
  pcVar29[0x6a] = -0x80;
  pcVar29[0x6b] = '\x7f';
  pcVar29[0x6c] = '\0';
  pcVar29[0x6d] = '\0';
  pcVar29[0x6e] = -0x80;
  pcVar29[0x6f] = '\x7f';
  pcVar29[0x40] = '\0';
  pcVar29[0x41] = '\0';
  pcVar29[0x42] = -0x80;
  pcVar29[0x43] = '\x7f';
  pcVar29[0x44] = '\0';
  pcVar29[0x45] = '\0';
  pcVar29[0x46] = -0x80;
  pcVar29[0x47] = '\x7f';
  pcVar29[0x48] = '\0';
  pcVar29[0x49] = '\0';
  pcVar29[0x4a] = -0x80;
  pcVar29[0x4b] = '\x7f';
  pcVar29[0x4c] = '\0';
  pcVar29[0x4d] = '\0';
  pcVar29[0x4e] = -0x80;
  pcVar29[0x4f] = '\x7f';
  pcVar29[0x20] = '\0';
  pcVar29[0x21] = '\0';
  pcVar29[0x22] = -0x80;
  pcVar29[0x23] = '\x7f';
  pcVar29[0x24] = '\0';
  pcVar29[0x25] = '\0';
  pcVar29[0x26] = -0x80;
  pcVar29[0x27] = '\x7f';
  pcVar29[0x28] = '\0';
  pcVar29[0x29] = '\0';
  pcVar29[0x2a] = -0x80;
  pcVar29[0x2b] = '\x7f';
  pcVar29[0x2c] = '\0';
  pcVar29[0x2d] = '\0';
  pcVar29[0x2e] = -0x80;
  pcVar29[0x2f] = '\x7f';
  pcVar29[0x70] = '\0';
  pcVar29[0x71] = '\0';
  pcVar29[0x72] = -0x80;
  pcVar29[0x73] = -1;
  pcVar29[0x74] = '\0';
  pcVar29[0x75] = '\0';
  pcVar29[0x76] = -0x80;
  pcVar29[0x77] = -1;
  pcVar29[0x78] = '\0';
  pcVar29[0x79] = '\0';
  pcVar29[0x7a] = -0x80;
  pcVar29[0x7b] = -1;
  pcVar29[0x7c] = '\0';
  pcVar29[0x7d] = '\0';
  pcVar29[0x7e] = -0x80;
  pcVar29[0x7f] = -1;
  pcVar29[0x50] = '\0';
  pcVar29[0x51] = '\0';
  pcVar29[0x52] = -0x80;
  pcVar29[0x53] = -1;
  pcVar29[0x54] = '\0';
  pcVar29[0x55] = '\0';
  pcVar29[0x56] = -0x80;
  pcVar29[0x57] = -1;
  pcVar29[0x58] = '\0';
  pcVar29[0x59] = '\0';
  pcVar29[0x5a] = -0x80;
  pcVar29[0x5b] = -1;
  pcVar29[0x5c] = '\0';
  pcVar29[0x5d] = '\0';
  pcVar29[0x5e] = -0x80;
  pcVar29[0x5f] = -1;
  pcVar29[0x30] = '\0';
  pcVar29[0x31] = '\0';
  pcVar29[0x32] = -0x80;
  pcVar29[0x33] = -1;
  pcVar29[0x34] = '\0';
  pcVar29[0x35] = '\0';
  pcVar29[0x36] = -0x80;
  pcVar29[0x37] = -1;
  pcVar29[0x38] = '\0';
  pcVar29[0x39] = '\0';
  pcVar29[0x3a] = -0x80;
  pcVar29[0x3b] = -1;
  pcVar29[0x3c] = '\0';
  pcVar29[0x3d] = '\0';
  pcVar29[0x3e] = -0x80;
  pcVar29[0x3f] = -1;
  pcVar29[0] = '\b';
  pcVar29[1] = '\0';
  pcVar29[2] = '\0';
  pcVar29[3] = '\0';
  pcVar29[4] = '\0';
  pcVar29[5] = '\0';
  pcVar29[6] = '\0';
  pcVar29[7] = '\0';
  pcVar29[8] = '\b';
  pcVar29[9] = '\0';
  pcVar29[10] = '\0';
  pcVar29[0xb] = '\0';
  pcVar29[0xc] = '\0';
  pcVar29[0xd] = '\0';
  pcVar29[0xe] = '\0';
  pcVar29[0xf] = '\0';
  pcVar29[0x10] = '\b';
  pcVar29[0x11] = '\0';
  pcVar29[0x12] = '\0';
  pcVar29[0x13] = '\0';
  pcVar29[0x14] = '\0';
  pcVar29[0x15] = '\0';
  pcVar29[0x16] = '\0';
  pcVar29[0x17] = '\0';
  pcVar29[0x18] = '\b';
  pcVar29[0x19] = '\0';
  pcVar29[0x1a] = '\0';
  pcVar29[0x1b] = '\0';
  pcVar29[0x1c] = '\0';
  pcVar29[0x1d] = '\0';
  pcVar29[0x1e] = '\0';
  pcVar29[0x1f] = '\0';
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1e0.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])local_1b8;
    local_1e0.depth = &local_2c8;
    local_1e0.children = (range<unsigned_int> (*) [8])&local_2a8;
    local_268[0xc] = proxy_support;
    local_268[0xd] = (context_traits)0x4;
    local_248[0] = (anon_union_16_2_47237d3f_for_Vec3fx_0)(ZEXT816(0) << 0x20);
    local_228 = CUSTOM_CTX;
    local_1e0.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize((task_group_context *)local_268);
    local_2c0.my_end = (unsigned_long)local_2d8;
    local_2c0.my_begin = 0;
    local_2c0.my_grainsize = 1;
    local_1c0.func = &local_1e0;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_2c0,&local_1c0,&local_2f9,(task_group_context *)local_268);
    cVar10 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_268);
    if (cVar10 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_268);
  }
  else {
    local_2e8._0_8_ = local_2c8 + 1;
    prVar31 = &local_2a8;
    psVar30 = (size_t *)&local_1b8[0].field_0x20;
    pMVar28 = local_2d8;
    do {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_268,this,local_2e8._0_8_,prVar31,
              alloc_00,false);
      (((ThreadLocal2 *)(psVar30 + -4))->mutex).mutex = (void *)local_268._0_8_;
      *(undefined8 *)(psVar30 + -2) = local_268._16_8_;
      psVar30[-1] = local_268._24_8_;
      *psVar30 = local_248[0]._0_8_;
      psVar30[1] = local_248[0]._8_8_;
      psVar30 = psVar30 + 6;
      prVar31 = prVar31 + 1;
      pMVar28 = (MutexSys *)((long)&pMVar28[-1].mutex + 7);
    } while (pMVar28 != (MutexSys *)0x0);
  }
  pBVar9 = local_2d0;
  pMVar28 = local_2d8;
  pauVar13 = (undefined1 (*) [16])&local_1b8[0].field_0x20;
  pMVar21 = (MutexSys *)0x0;
  local_2e8._8_4_ = 0x7f800000;
  local_2e8._0_8_ = 0x7f8000007f800000;
  local_2e8._12_4_ = 0x7f800000;
  local_2f8._8_4_ = 0xff800000;
  local_2f8._0_8_ = 0xff800000ff800000;
  local_2f8._12_4_ = 0xff800000;
  do {
    auVar32 = pauVar13[-1];
    auVar3 = *pauVar13;
    *(undefined8 *)(pcVar29 + (long)pMVar21 * 8) = *(undefined8 *)pauVar13[-2];
    *(int *)(pcVar29 + (long)pMVar21 * 4 + 0x20) = auVar32._0_4_;
    uVar5 = vextractps_avx(auVar32,1);
    *(undefined4 *)(pcVar29 + (long)pMVar21 * 4 + 0x40) = uVar5;
    uVar5 = vextractps_avx(auVar32,2);
    *(undefined4 *)(pcVar29 + (long)pMVar21 * 4 + 0x60) = uVar5;
    *(int *)(pcVar29 + (long)pMVar21 * 4 + 0x30) = auVar3._0_4_;
    uVar5 = vextractps_avx(auVar3,1);
    *(undefined4 *)(pcVar29 + (long)pMVar21 * 4 + 0x50) = uVar5;
    local_2e8 = vminps_avx(local_2e8,auVar32);
    uVar5 = vextractps_avx(auVar3,2);
    *(undefined4 *)(pcVar29 + (long)pMVar21 * 4 + 0x70) = uVar5;
    local_2f8 = vmaxps_avx(local_2f8,auVar3);
    pMVar21 = (MutexSys *)((long)&pMVar21->mutex + 1);
    pauVar13 = pauVar13 + 3;
  } while (local_2d8 != pMVar21);
  piVar14 = (int *)&local_1b8[0].field_0x1c;
  uVar20 = 0;
  pMVar21 = local_2d8;
  do {
    uVar20 = uVar20 + (long)*piVar14;
    piVar14 = piVar14 + 0xc;
    pMVar21 = (MutexSys *)((long)&pMVar21[-1].mutex + 7);
  } while (pMVar21 != (MutexSys *)0x0);
  if (0xfff < uVar20) {
    piVar14 = (int *)&local_1b8[0].field_0x1c;
    pMVar21 = (MutexSys *)0x0;
    do {
      if (*piVar14 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar29 + (long)pMVar21 * 8),1);
        pcVar29[(long)pMVar21 * 8 + 7] = pcVar29[(long)pMVar21 * 8 + 7] | 0x80;
      }
      pMVar21 = (MutexSys *)((long)&pMVar21->mutex + 1);
      piVar14 = piVar14 + 0xc;
    } while (pMVar28 != pMVar21);
  }
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_2e8,ZEXT416((uint)uVar20),0x30)
  ;
  (pBVar9->ref).ptr = (size_t)pcVar29;
  (pBVar9->bounds).lower.field_0 = aVar7;
  *(undefined8 *)&(pBVar9->bounds).upper.field_0 = local_2f8._0_8_;
  *(undefined8 *)((long)&(pBVar9->bounds).upper.field_0 + 8) = local_2f8._8_8_;
  return pBVar9;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }